

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qhash.h
# Opt level: O2

Bucket __thiscall
QHashPrivate::Data<QHashPrivate::Node<unsigned_char*,QFSFileEnginePrivate::StartAndLength>>::
findBucketWithHash<unsigned_char*>
          (Data<QHashPrivate::Node<unsigned_char*,QFSFileEnginePrivate::StartAndLength>> *this,
          uchar **key,size_t hash)

{
  ulong uVar1;
  long in_FS_OFFSET;
  Bucket BVar2;
  Bucket local_30;
  long local_20;
  
  local_20 = *(long *)(in_FS_OFFSET + 0x28);
  uVar1 = *(long *)(this + 0x10) - 1U & hash;
  local_30.span = (Span *)((uVar1 >> 7) * 0x90 + *(long *)(this + 0x20));
  local_30.index = (size_t)((uint)uVar1 & 0x7f);
  while (((ulong)(local_30.span)->offsets[local_30.index] != 0xff &&
         (*(uchar **)(local_30.span)->entries[(local_30.span)->offsets[local_30.index]].storage.data
          != *key))) {
    Data<QHashPrivate::Node<unsigned_char_*,_QFSFileEnginePrivate::StartAndLength>_>::Bucket::
    advanceWrapped(&local_30,
                   (Data<QHashPrivate::Node<unsigned_char_*,_QFSFileEnginePrivate::StartAndLength>_>
                    *)this);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_20) {
    BVar2.index = local_30.index;
    BVar2.span = local_30.span;
    return BVar2;
  }
  __stack_chk_fail();
}

Assistant:

Bucket findBucketWithHash(const K &key, size_t hash) const noexcept
    {
        static_assert(std::is_same_v<std::remove_cv_t<Key>, K> ||
                QHashHeterogeneousSearch<std::remove_cv_t<Key>, K>::value);
        Q_ASSERT(numBuckets > 0);
        Bucket bucket(this, GrowthPolicy::bucketForHash(numBuckets, hash));
        // loop over the buckets until we find the entry we search for
        // or an empty slot, in which case we know the entry doesn't exist
        while (true) {
            size_t offset = bucket.offset();
            if (offset == SpanConstants::UnusedEntry) {
                return bucket;
            } else {
                Node &n = bucket.nodeAtOffset(offset);
                if (qHashEquals(n.key, key))
                    return bucket;
            }
            bucket.advanceWrapped(this);
        }
    }